

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall QListModel::insert(QListModel *this,int row,QListWidgetItem *item)

{
  QList<QListWidgetItem_*> *this_00;
  ulong uVar1;
  QListWidget *pQVar2;
  iterator iVar3;
  iterator iVar4;
  P _a;
  long lVar5;
  int iVar6;
  long in_FS_OFFSET;
  iterator local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  iterator local_40;
  long local_38;
  long lVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (item != (QListWidgetItem *)0x0) {
    pQVar2 = (QListWidget *)QMetaObject::cast((QObject *)&QListWidget::staticMetaObject);
    item->view = pQVar2;
    if ((pQVar2 == (QListWidget *)0x0) ||
       (*(char *)(*(long *)&(pQVar2->super_QListView).super_QAbstractItemView.
                            super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8 + 0x5c0)
        != '\x01')) {
      if (row < 0) {
        iVar6 = 0;
      }
      else {
        uVar1 = (this->items).d.size;
        if ((uint)row <= uVar1) {
          uVar1 = (ulong)(uint)row;
        }
        iVar6 = (int)uVar1;
      }
    }
    else {
      this_00 = &this->items;
      local_58 = QList<QListWidgetItem_*>::begin(this_00);
      local_40 = QList<QListWidgetItem_*>::end(this_00);
      iVar3 = sortedInsertionIterator
                        (&local_58,&local_40,
                         *(SortOrder *)
                          (*(long *)&(item->view->super_QListView).super_QAbstractItemView.
                                     super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8
                          + 0x5bc),item);
      iVar4 = QList<QListWidgetItem_*>::begin(this_00);
      lVar5 = (long)iVar3.i - (long)iVar4.i >> 3;
      lVar7 = 0;
      if (0 < lVar5) {
        lVar7 = lVar5;
      }
      iVar6 = (int)lVar7;
    }
    local_58.i = (QListWidgetItem **)0xffffffffffffffff;
    local_50 = 0;
    uStack_48 = 0;
    QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)&local_58,iVar6);
    local_58.i = (QListWidgetItem **)item;
    QtPrivate::QPodArrayOps<QListWidgetItem*>::emplace<QListWidgetItem*&>
              ((QPodArrayOps<QListWidgetItem*> *)&this->items,(long)iVar6,
               (QListWidgetItem **)&local_58);
    QList<QListWidgetItem_*>::begin(&this->items);
    item->d->theid = iVar6;
    QAbstractItemModel::endInsertRows();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListModel::insert(int row, QListWidgetItem *item)
{
    if (!item)
        return;

    item->view = this->view();
    if (item->view && item->view->isSortingEnabled()) {
        // sorted insertion
        QList<QListWidgetItem*>::iterator it;
        it = sortedInsertionIterator(items.begin(), items.end(),
                                     item->view->sortOrder(), item);
        row = qMax<qsizetype>(it - items.begin(), 0);
    } else {
        if (row < 0)
            row = 0;
        else if (row > items.size())
            row = items.size();
    }
    beginInsertRows(QModelIndex(), row, row);
    items.insert(row, item);
    item->d->theid = row;
    endInsertRows();
}